

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O2

void llvm::yaml::ScalarTraits<llvm::yaml::Hex64,_void>::output
               (Hex64 *Val,void *param_2,raw_ostream *Out)

{
  format_object_base local_20;
  uint64_t local_10;
  
  local_10 = Val->value;
  local_20.Fmt = "0x%016llX";
  local_20._vptr_format_object_base = (_func_int **)&PTR_home_01127cf0;
  raw_ostream::operator<<(Out,&local_20);
  return;
}

Assistant:

void ScalarTraits<Hex64>::output(const Hex64 &Val, void *, raw_ostream &Out) {
  uint64_t Num = Val;
  Out << format("0x%016llX", Num);
}